

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  cmCTestTestProperties *prop;
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  reference pbVar5;
  ostream *poVar6;
  void *this_01;
  char *pcVar7;
  string local_1460 [32];
  ostringstream local_1440 [8];
  ostringstream cmCTestLog_msg_9;
  string local_12c8 [32];
  ostringstream local_12a8 [8];
  ostringstream cmCTestLog_msg_8;
  string local_1130 [32];
  undefined1 local_1110 [8];
  ostringstream cmCTestLog_msg_7;
  string local_f98 [32];
  undefined1 local_f78 [8];
  ostringstream cmCTestLog_msg_6;
  string local_e00 [32];
  string local_de0 [36];
  int local_dbc;
  undefined1 local_db8 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_c40 [8];
  ostringstream indexStr;
  string local_ac8 [32];
  undefined1 local_aa8 [8];
  ostringstream cmCTestLog_msg_4;
  string local_930 [32];
  undefined1 local_910 [8];
  ostringstream cmCTestLog_msg_3;
  string local_798 [32];
  ostringstream local_778 [8];
  ostringstream cmCTestLog_msg_2;
  string local_600 [32];
  undefined1 local_5e0 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  iterator label;
  undefined1 local_438 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_2b0 [8];
  cmCTestRunTest testRun;
  cmWorkingDirectory workdir;
  cmCTestTestProperties *p;
  _Self local_20;
  iterator it;
  int count;
  cmCTestMultiProcessHandler *this_local;
  
  this_00 = this->TestHandler;
  iVar3 = FindMaxIndex(this);
  cmCTestTestHandler::SetMaxIndex(this_00,iVar3);
  it._M_node._4_4_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ::begin(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
  while( true ) {
    p = (cmCTestTestProperties *)
        std::
        map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
        ::end(&(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             );
    bVar2 = std::operator!=(&local_20,(_Self *)&p);
    if (!bVar2) break;
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator->(&local_20);
    prop = ppVar4->second;
    cmWorkingDirectory::cmWorkingDirectory
              ((cmWorkingDirectory *)&testRun.TotalNumberOfTests,&prop->Directory);
    cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_2b0,this->TestHandler);
    cmCTestRunTest::SetIndex((cmCTestRunTest *)local_2b0,prop->Index);
    cmCTestRunTest::SetTestProperties((cmCTestRunTest *)local_2b0,prop);
    cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_2b0);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&prop->Labels);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::operator<<((ostream *)local_438,"Labels:");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2b9,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string((string *)&label);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    }
    local_460._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&prop->Labels);
    while( true ) {
      local_468._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&prop->Labels);
      bVar2 = __gnu_cxx::operator!=(&local_460,&local_468);
      if (!bVar2) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e0);
      poVar6 = std::operator<<((ostream *)local_5e0," ");
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_460);
      std::operator<<(poVar6,(string *)pbVar5);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2be,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_460);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&prop->Labels);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_778);
      std::ostream::operator<<(local_778,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2c3,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_798);
      std::__cxx11::ostringstream::~ostringstream(local_778);
    }
    if ((this->TestHandler->MemCheck & 1U) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_aa8);
      std::operator<<((ostream *)local_aa8,"  Test");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2ca,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_ac8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_aa8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_910);
      std::operator<<((ostream *)local_910,"  Memory Check");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2c8,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_930);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_910);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c40);
    poVar6 = std::operator<<((ostream *)local_c40," #");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,prop->Index);
    std::operator<<(poVar6,":");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_db8);
    iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
    iVar3 = getNumWidth((long)iVar3);
    local_dbc = (int)std::setw(iVar3 + 3);
    poVar6 = std::operator<<((ostream *)local_db8,(_Setw)local_dbc);
    std::__cxx11::ostringstream::str();
    std::operator<<(poVar6,local_de0);
    std::__cxx11::string::~string(local_de0);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x2d2,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_e00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_db8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f78);
    poVar6 = std::operator<<((ostream *)local_f78," ");
    std::operator<<(poVar6,(string *)prop);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x2d4,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_f98);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f78);
    if ((prop->Disabled & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1110);
      std::operator<<((ostream *)local_1110," (Disabled)");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2d7,pcVar7,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_1130);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1110);
    }
    std::__cxx11::ostringstream::ostringstream(local_12a8);
    std::ostream::operator<<(local_12a8,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x2d9,pcVar7,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_12c8);
    std::__cxx11::ostringstream::~ostringstream(local_12a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c40);
    cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_2b0);
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&testRun.TotalNumberOfTests);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&local_20);
  }
  std::__cxx11::ostringstream::ostringstream(local_1440);
  poVar6 = (ostream *)std::ostream::operator<<(local_1440,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"Total Tests: ");
  this_01 = (void *)std::ostream::operator<<(poVar6,this->Total);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x2de,pcVar7,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string(local_1460);
  std::__cxx11::ostringstream::~ostringstream(local_1440);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  int count = 0;

  for (PropertiesMap::iterator it = this->Properties.begin();
       it != this->Properties.end(); ++it) {
    count++;
    cmCTestTestHandler::cmCTestTestProperties& p = *it->second;

    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(this->TestHandler);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Labels:",
                         this->Quiet);
    }
    for (std::vector<std::string>::iterator label = p.Labels.begin();
         label != p.Labels.end(); ++label) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << *label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}